

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall AixLog::Metadata::Metadata(Metadata *this)

{
  this->severity = trace;
  Tag::Tag(&this->tag,(nullptr_t)0x0);
  Function::Function(&this->function,(nullptr_t)0x0);
  (this->timestamp)._vptr_Timestamp = (_func_int **)&PTR__Timestamp_001d8f28;
  (this->timestamp).time_point.__d.__r = 0;
  (this->timestamp).is_null_ = true;
  return;
}

Assistant:

Metadata()
      : severity(Severity::trace),
        tag(nullptr),
        function(nullptr),
        timestamp(nullptr) {}